

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O1

int64_t av1_refine_integerized_param
                  (WarpedMotionParams *wm,TransformationType wmtype,int use_hbd,int bd,uint8_t *ref,
                  int r_width,int r_height,int r_stride,uint8_t *dst,int d_width,int d_height,
                  int d_stride,int n_refinements,int64_t ref_frame_error,uint8_t *segment_map,
                  int segment_map_stride,double gm_erroradv_tr)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int64_t iVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  undefined7 in_register_00000031;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  TransformationType TVar16;
  int p_height;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar17;
  int iVar18;
  undefined4 in_stack_ffffffffffffff94;
  int local_5c;
  long local_58;
  
  uVar10 = (uint)CONCAT71(in_register_00000031,wmtype);
  uVar17 = av1_refine_integerized_param::max_trans_model_params
           [CONCAT71(in_register_00000031,wmtype) & 0xffffffff];
  if (uVar10 != 2) {
    if (uVar10 != 1) {
      if (uVar10 != 0) goto LAB_003bf1d2;
      wm->wmmat[0] = 0;
      wm->wmmat[1] = 0;
    }
    wm->wmmat[2] = 0x10000;
    wm->wmmat[3] = 0;
  }
  wm->wmmat[4] = -wm->wmmat[3];
  wm->wmmat[5] = wm->wmmat[2];
LAB_003bf1d2:
  wm->wmtype = wmtype;
  if ((((wm->wmmat[5] == 0x10000) && (wm->wmmat[4] == 0)) && (wm->wmmat[2] == 0x10000)) &&
     (wm->wmmat[3] == 0)) {
    TVar16 = '\x01';
    if (wm->wmmat[1] == 0) {
      TVar16 = wm->wmmat[0] != 0;
    }
  }
  else if ((wm->wmmat[2] != wm->wmmat[5]) || (TVar16 = '\x02', wm->wmmat[3] + wm->wmmat[4] != 0)) {
    TVar16 = '\x03';
  }
  wm->wmtype = TVar16;
  p_height = (int)segment_map;
  if (n_refinements == 0) {
    lVar5 = lrint((double)ref_frame_error * gm_erroradv_tr);
    local_58 = get_warp_error(wm,use_hbd,bd,ref,r_width,r_height,r_stride,dst,d_stride,d_width,
                              d_height,(int)lVar5,p_height,segment_map_stride,
                              in_stack_ffffffffffffff88,
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              (uint8_t *)CONCAT44(bd,use_hbd),r_width);
  }
  else {
    lVar5 = lrint((double)ref_frame_error * 0.7);
    local_58 = get_warp_error(wm,use_hbd,bd,ref,r_width,r_height,r_stride,dst,d_stride,d_width,
                              d_height,(int)lVar5,p_height,segment_map_stride,
                              in_stack_ffffffffffffff88,CONCAT44(uVar10,uVar17),
                              (uint8_t *)CONCAT44(bd,use_hbd),r_width);
    if (lVar5 < local_58) {
      local_58 = 0x7fffffffffffffff;
    }
    else {
      if (0 < n_refinements) {
        local_5c = 1 << ((char)n_refinements - 1U & 0x1f);
        uVar6 = 1;
        if (1 < (int)uVar17) {
          uVar6 = (ulong)uVar17;
        }
        iVar9 = 0;
        uVar3 = uVar10 & 0xff;
        uVar17 = uVar10;
        do {
          if ((char)uVar10 != '\0') {
            uVar15 = 0;
            do {
              iVar18 = wm->wmmat[uVar15];
              uVar2 = (uint)(uVar15 == 5 || uVar15 == 2);
              iVar12 = uVar2 * 0x10000;
              bVar8 = (byte)(&DAT_00566ba8)[1 < uVar15];
              iVar14 = (int)(iVar18 + uVar2 * -0x10000) >> (bVar8 & 0x1f);
              iVar11 = iVar14 - local_5c;
              iVar1 = (&DAT_00566bb0)[1 < uVar15];
              iVar13 = -iVar1;
              iVar4 = iVar1;
              if (iVar11 < iVar1) {
                iVar4 = iVar11;
              }
              if (SBORROW4(iVar11,iVar13) != iVar11 + iVar1 < 0) {
                iVar4 = iVar13;
              }
              wm->wmmat[uVar15] = (iVar4 << (bVar8 & 0x1f)) + iVar12;
              if ((TransformationType)uVar10 == '\x02') {
LAB_003bf41b:
                wm->wmmat[4] = -wm->wmmat[3];
                wm->wmmat[5] = wm->wmmat[2];
              }
              else {
                if (uVar3 == 1) {
LAB_003bf413:
                  wm->wmmat[2] = 0x10000;
                  wm->wmmat[3] = 0;
                  goto LAB_003bf41b;
                }
                if (uVar3 == 0) {
                  wm->wmmat[0] = 0;
                  wm->wmmat[1] = 0;
                  goto LAB_003bf413;
                }
              }
              wm->wmtype = (TransformationType)uVar10;
              iVar7 = get_warp_error(wm,use_hbd,bd,ref,r_width,r_height,r_stride,dst,d_stride,
                                     d_width,d_height,(int)local_58,p_height,segment_map_stride,
                                     in_stack_ffffffffffffff88,CONCAT44(uVar17,iVar18),
                                     (uint8_t *)CONCAT44(bd,use_hbd),r_width);
              iVar4 = 0;
              if (iVar7 < local_58) {
                iVar18 = wm->wmmat[uVar15];
                iVar4 = -1;
                local_58 = iVar7;
              }
              iVar14 = iVar14 + local_5c;
              iVar11 = iVar1;
              if (iVar14 < iVar1) {
                iVar11 = iVar14;
              }
              if (SBORROW4(iVar14,iVar13) != iVar14 + iVar1 < 0) {
                iVar11 = iVar13;
              }
              wm->wmmat[uVar15] = (iVar11 << (bVar8 & 0x1f)) + iVar12;
              if ((TransformationType)uVar17 == '\x02') {
LAB_003bf4f2:
                wm->wmmat[4] = -wm->wmmat[3];
                wm->wmmat[5] = wm->wmmat[2];
              }
              else {
                if (uVar3 == 1) {
LAB_003bf4ea:
                  wm->wmmat[2] = 0x10000;
                  wm->wmmat[3] = 0;
                  goto LAB_003bf4f2;
                }
                if (uVar3 == 0) {
                  wm->wmmat[0] = 0;
                  wm->wmmat[1] = 0;
                  goto LAB_003bf4ea;
                }
              }
              wm->wmtype = (TransformationType)uVar17;
              iVar7 = get_warp_error(wm,use_hbd,bd,ref,r_width,r_height,r_stride,dst,d_stride,
                                     d_width,d_height,(int)local_58,p_height,segment_map_stride,
                                     in_stack_ffffffffffffff88,CONCAT44(uVar17,iVar18),
                                     (uint8_t *)CONCAT44(bd,use_hbd),r_width);
              uVar10 = uVar17;
              if (iVar7 < local_58) {
                iVar18 = wm->wmmat[uVar15];
                iVar4 = 1;
                local_58 = iVar7;
              }
              while (iVar11 = iVar4, TVar16 = (TransformationType)uVar10, iVar11 != 0) {
                iVar14 = ((int)(iVar18 + uVar2 * -0x10000) >> (bVar8 & 0x1f)) + iVar11 * local_5c;
                iVar4 = iVar1;
                if (iVar14 < iVar1) {
                  iVar4 = iVar14;
                }
                if (SBORROW4(iVar14,iVar13) != iVar14 + iVar1 < 0) {
                  iVar4 = iVar13;
                }
                wm->wmmat[uVar15] = (iVar4 << (bVar8 & 0x1f)) + iVar12;
                if (TVar16 == '\x02') {
LAB_003bf5e3:
                  wm->wmmat[4] = -wm->wmmat[3];
                  wm->wmmat[5] = wm->wmmat[2];
                }
                else {
                  if (uVar3 == 1) {
LAB_003bf5db:
                    wm->wmmat[2] = 0x10000;
                    wm->wmmat[3] = 0;
                    goto LAB_003bf5e3;
                  }
                  if (uVar3 == 0) {
                    wm->wmmat[0] = 0;
                    wm->wmmat[1] = 0;
                    goto LAB_003bf5db;
                  }
                }
                wm->wmtype = TVar16;
                iVar7 = get_warp_error(wm,use_hbd,bd,ref,r_width,r_height,r_stride,dst,d_stride,
                                       d_width,d_height,(int)local_58,p_height,segment_map_stride,
                                       in_stack_ffffffffffffff88,CONCAT44(uVar10,iVar18),
                                       (uint8_t *)CONCAT44(bd,use_hbd),r_width);
                iVar4 = 0;
                if (iVar7 < local_58) {
                  iVar18 = wm->wmmat[uVar15];
                  iVar4 = iVar11;
                  local_58 = iVar7;
                }
              }
              wm->wmmat[uVar15] = iVar18;
              if (TVar16 == '\x02') {
LAB_003bf6da:
                wm->wmmat[4] = -wm->wmmat[3];
                wm->wmmat[5] = wm->wmmat[2];
              }
              else {
                if (uVar3 == 1) {
LAB_003bf6d2:
                  wm->wmmat[2] = 0x10000;
                  wm->wmmat[3] = 0;
                  goto LAB_003bf6da;
                }
                if (uVar3 == 0) {
                  wm->wmmat[0] = 0;
                  wm->wmmat[1] = 0;
                  goto LAB_003bf6d2;
                }
              }
              wm->wmtype = TVar16;
              uVar15 = uVar15 + 1;
              uVar17 = uVar10;
            } while (uVar15 != uVar6);
          }
          iVar9 = iVar9 + 1;
          local_5c = local_5c >> 1;
        } while (iVar9 != n_refinements);
      }
      if (((wm->wmmat[5] == 0x10000) && (wm->wmmat[4] == 0)) &&
         ((wm->wmmat[2] == 0x10000 && (wm->wmmat[3] == 0)))) {
        TVar16 = '\x01';
        if (wm->wmmat[1] == 0) {
          TVar16 = wm->wmmat[0] != 0;
        }
      }
      else if ((wm->wmmat[2] != wm->wmmat[5]) || (TVar16 = '\x02', wm->wmmat[3] + wm->wmmat[4] != 0)
              ) {
        TVar16 = '\x03';
      }
      wm->wmtype = TVar16;
      av1_get_shear_params(wm);
    }
  }
  return local_58;
}

Assistant:

int64_t av1_refine_integerized_param(
    WarpedMotionParams *wm, TransformationType wmtype, int use_hbd, int bd,
    uint8_t *ref, int r_width, int r_height, int r_stride, uint8_t *dst,
    int d_width, int d_height, int d_stride, int n_refinements,
    int64_t ref_frame_error, uint8_t *segment_map, int segment_map_stride,
    double gm_erroradv_tr) {
  static const int max_trans_model_params[TRANS_TYPES] = { 0, 2, 4, 6 };
  const int border = ERRORADV_BORDER;
  int i = 0, p;
  int n_params = max_trans_model_params[wmtype];
  int32_t *param_mat = wm->wmmat;
  int64_t step_error, best_error;
  int32_t step;
  int32_t *param;
  int32_t curr_param;
  int32_t best_param;

  force_wmtype(wm, wmtype);
  wm->wmtype = get_wmtype(wm);

  if (n_refinements == 0) {
    // Compute the maximum error value that will be accepted, so that
    // get_warp_error can terminate early if it proves the model will not
    // be accepted.
    int64_t selection_threshold =
        (int64_t)lrint(ref_frame_error * gm_erroradv_tr);
    return get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                          dst + border * d_stride + border, d_stride, border,
                          border, d_width - 2 * border, d_height - 2 * border,
                          0, 0, selection_threshold, segment_map,
                          segment_map_stride);
  }

  // When refining, use a slightly higher threshold for the initial error
  // calculation - see comment above erroradv_early_tr for why.
  int64_t selection_threshold =
      (int64_t)lrint(ref_frame_error * erroradv_early_tr);
  best_error =
      get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                     dst + border * d_stride + border, d_stride, border, border,
                     d_width - 2 * border, d_height - 2 * border, 0, 0,
                     selection_threshold, segment_map, segment_map_stride);

  if (best_error > selection_threshold) {
    return INT64_MAX;
  }

  step = 1 << (n_refinements - 1);
  for (i = 0; i < n_refinements; i++, step >>= 1) {
    for (p = 0; p < n_params; ++p) {
      int step_dir = 0;
      param = param_mat + p;
      curr_param = *param;
      best_param = curr_param;
      // look to the left
      // Note: We have to use force_wmtype() to keep the proper symmetry for
      // ROTZOOM type models
      *param = add_param_offset(p, curr_param, -step);
      force_wmtype(wm, wmtype);
      step_error =
          get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                         dst + border * d_stride + border, d_stride, border,
                         border, d_width - 2 * border, d_height - 2 * border, 0,
                         0, best_error, segment_map, segment_map_stride);
      if (step_error < best_error) {
        best_error = step_error;
        best_param = *param;
        step_dir = -1;
      }

      // look to the right
      *param = add_param_offset(p, curr_param, step);
      force_wmtype(wm, wmtype);
      step_error =
          get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                         dst + border * d_stride + border, d_stride, border,
                         border, d_width - 2 * border, d_height - 2 * border, 0,
                         0, best_error, segment_map, segment_map_stride);
      if (step_error < best_error) {
        best_error = step_error;
        best_param = *param;
        step_dir = 1;
      }

      // look to the direction chosen above repeatedly until error increases
      // for the biggest step size
      while (step_dir) {
        *param = add_param_offset(p, best_param, step * step_dir);
        force_wmtype(wm, wmtype);
        step_error =
            get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                           dst + border * d_stride + border, d_stride, border,
                           border, d_width - 2 * border, d_height - 2 * border,
                           0, 0, best_error, segment_map, segment_map_stride);
        if (step_error < best_error) {
          best_error = step_error;
          best_param = *param;
        } else {
          step_dir = 0;
        }
      }

      // Restore best parameter value so far
      *param = best_param;
      force_wmtype(wm, wmtype);
    }
  }

  wm->wmtype = get_wmtype(wm);
  // Recompute shear params for the refined model
  // This should never fail, because we only ever consider warp-able models
  if (!av1_get_shear_params(wm)) {
    assert(0);
  }
  return best_error;
}